

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O3

int __thiscall deci::ast_exit_t::Generate(ast_exit_t *this,ostream *output,int pc)

{
  ast_item_t *paVar1;
  int iVar2;
  string *psVar3;
  ostream *poVar4;
  runtime_error *this_00;
  
  paVar1 = (this->super_ast_item_t).parent;
  if (paVar1 == (ast_item_t *)0x0) {
    ast_item_t::EndLocationTag_abi_cxx11_(&this->super_ast_item_t);
  }
  else {
    iVar2 = (*paVar1->_vptr_ast_item_t[1])();
    psVar3 = ast_item_t::EndLocationTag_abi_cxx11_(&this->super_ast_item_t);
    if (-1 < iVar2) {
      std::__ostream_insert<char,std::char_traits<char>>(output,"jmp __end_",10);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (output,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"__",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      return pc + 1;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Exit statement not allowed in non-loop context");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int ast_exit_t::Generate(std::ostream &output, int pc) const {

    int                end_loc = this->EndLocationPos();
    const std::string& end_tag = this->EndLocationTag();

    if (end_loc < 0) 
    {
      throw std::runtime_error("Exit statement not allowed in non-loop context");
    }

    output << "jmp __end_" << end_tag << "_" << end_loc << "__" << std::endl;
    return pc + 1;
  }